

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-help.c
# Opt level: O0

void do_cmd_help(void)

{
  char *name;
  
  screen_save();
  name = "index.txt";
  if (((player->opts).opt[1] & 1U) != 0) {
    name = "r_index.txt";
  }
  show_file(name,(char *)0x0,0,0);
  screen_load();
  return;
}

Assistant:

void do_cmd_help(void)
{
	/* Save screen */
	screen_save();

	/* Peruse the main help file */
	(void)show_file((OPT(player, rogue_like_commands)) ?
		"r_index.txt" : "index.txt", NULL, 0, 0);

	/* Load screen */
	screen_load();
}